

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>::ModeState
          (ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *this)

{
  this->count = 0;
  this->scan = (ColumnDataScanState *)0x0;
  (this->prevs).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prevs).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prevs).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->frequency_map = (Counts *)0x0;
  this->mode = (interval_t *)0x0;
  this->nonzero = 0;
  this->valid = false;
  DataChunk::DataChunk(&this->page);
  this->data = (interval_t *)0x0;
  this->validity = (ValidityMask *)0x0;
  return;
}

Assistant:

ModeState() {
	}